

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O2

void __thiscall QMimeXMLProvider::addAllMimeTypes(QMimeXMLProvider *this,QList<QMimeType> *result)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  bool bVar6;
  Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *pDVar7;
  ulong uVar8;
  long lVar9;
  const_iterator __it;
  QMimeType *pQVar10;
  const_iterator cVar11;
  long lVar12;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_d0;
  QArrayDataPointer<char16_t> local_b8;
  piter local_98;
  Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *local_88;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((result->d).size == 0) {
    local_50._0_16_ = QHash<QString,_QMimeTypeXMLData>::constBegin(&this->m_nameMimeTypeMap);
    while( true ) {
      if (local_50.d == (Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)0x0 &&
          local_50.ptr == 0) break;
      pSVar2 = (local_50.d)->spans;
      uVar8 = local_50.ptr >> 7;
      QMimeTypePrivate::QMimeTypePrivate
                ((QMimeTypePrivate *)&local_88,
                 (QString *)
                 (pSVar2[uVar8].entries[pSVar2[uVar8].offsets[(uint)local_50.ptr & 0x7f]].storage.
                  data + 0x20));
      QMimeType::QMimeType((QMimeType *)&local_68,(QMimeTypePrivate *)&local_88);
      QList<QMimeType>::emplaceBack<QMimeType>(result,(QMimeType *)&local_68);
      QMimeType::~QMimeType((QMimeType *)&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      QHashPrivate::iterator<QHashPrivate::Node<QString,_QMimeTypeXMLData>_>::operator++
                ((iterator<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)&local_50);
    }
  }
  else {
    local_98 = (piter)QHash<QString,_QMimeTypeXMLData>::constBegin(&this->m_nameMimeTypeMap);
    while( true ) {
      if (local_98.d == (Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)0x0 &&
          local_98.bucket == 0) break;
      pSVar2 = (local_98.d)->spans;
      uVar8 = local_98.bucket >> 7;
      pEVar3 = pSVar2[uVar8].entries;
      bVar1 = pSVar2[uVar8].offsets[(uint)local_98.bucket & 0x7f];
      local_b8.d = *(Data **)pEVar3[bVar1].storage.data;
      pDVar4 = *(Data **)(pEVar3[bVar1].storage.data + 8);
      pcVar5 = *(char16_t **)(pEVar3[bVar1].storage.data + 0x10);
      if ((Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)local_b8.d ==
          (Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)0x0) {
        local_d0.d = (Data *)0x0;
      }
      else {
        LOCK();
        (((Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)local_b8.d)->ref).atomic._q_value.
        super___atomic_base<int>._M_i =
             (((Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)local_b8.d)->ref).atomic.
             _q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        local_d0.d = local_b8.d;
      }
      __it.i = (result->d).ptr;
      lVar12 = (result->d).size;
      if ((Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)local_d0.d ==
          (Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)0x0) {
        local_68.d = (Data *)0x0;
      }
      else {
        LOCK();
        (((Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)local_d0.d)->ref).atomic._q_value.
        super___atomic_base<int>._M_i =
             (((Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)local_d0.d)->ref).atomic.
             _q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        local_68.d = local_d0.d;
      }
      if ((Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)local_68.d ==
          (Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)0x0) {
        local_88 = (Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)0x0;
      }
      else {
        LOCK();
        (((Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)local_68.d)->ref).atomic._q_value.
        super___atomic_base<int>._M_i =
             (((Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)local_68.d)->ref).atomic.
             _q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        local_88 = (Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)local_68.d;
      }
      if (local_88 == (Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)0x0) {
        pDVar7 = (Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)0x0;
      }
      else {
        LOCK();
        (local_88->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (local_88->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDVar7 = local_88;
      }
      local_50.ptr = (char16_t *)pDVar4;
      local_50.d = (Data *)pDVar7;
      if (pDVar7 == (Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)0x0) {
        pDVar7 = (Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)0x0;
      }
      else {
        LOCK();
        (pDVar7->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar7->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_d0.ptr = (char16_t *)pDVar4;
      local_d0.size = (qsizetype)pcVar5;
      local_b8.ptr = (char16_t *)pDVar4;
      local_b8.size = (qsizetype)pcVar5;
      local_80.d = pDVar4;
      local_80.ptr = pcVar5;
      local_68.ptr = (char16_t *)pDVar4;
      local_68.size = (qsizetype)pcVar5;
      local_50.size = (qsizetype)pcVar5;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
      if (pDVar7 != (Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)0x0) {
        LOCK();
        (pDVar7->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar7->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQVar10 = __it.i + lVar12;
      lVar9 = lVar12 << 3;
      local_88 = pDVar7;
      local_80.d = pDVar4;
      local_80.ptr = pcVar5;
      for (lVar12 = lVar12 >> 2; 0 < lVar12; lVar12 = lVar12 + -1) {
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                          ((_Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::__0> *)
                           &local_88,__it);
        cVar11.i = __it.i;
        if (bVar6) goto LAB_0044b944;
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                          ((_Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::__0> *)
                           &local_88,__it.i + 1);
        cVar11.i = __it.i + 1;
        if (bVar6) goto LAB_0044b944;
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                          ((_Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::__0> *)
                           &local_88,__it.i + 2);
        cVar11.i = __it.i + 2;
        if (bVar6) goto LAB_0044b944;
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                          ((_Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::__0> *)
                           &local_88,__it.i + 3);
        cVar11.i = __it.i + 3;
        if (bVar6) goto LAB_0044b944;
        __it.i = __it.i + 4;
        lVar9 = lVar9 + -0x20;
      }
      lVar9 = lVar9 >> 3;
      if (lVar9 == 1) {
LAB_0044b930:
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                          ((_Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::__0> *)
                           &local_88,__it);
        cVar11.i = pQVar10;
        if (bVar6) {
          cVar11.i = __it.i;
        }
      }
      else if (lVar9 == 2) {
LAB_0044b918:
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                          ((_Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::__0> *)
                           &local_88,__it);
        cVar11.i = __it.i;
        if (!bVar6) {
          __it.i = __it.i + 1;
          goto LAB_0044b930;
        }
      }
      else {
        cVar11.i = pQVar10;
        if ((lVar9 == 3) &&
           (bVar6 = __gnu_cxx::__ops::
                    _Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::
                    operator()((_Iter_pred<QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                                *)&local_88,__it), cVar11.i = __it.i, !bVar6)) {
          __it.i = __it.i + 1;
          goto LAB_0044b918;
        }
      }
LAB_0044b944:
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      lVar12 = (result->d).size;
      pQVar10 = (result->d).ptr;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
      if (cVar11.i == pQVar10 + lVar12) {
        QMimeTypePrivate::QMimeTypePrivate
                  ((QMimeTypePrivate *)&local_88,
                   (QString *)
                   ((local_98.d)->spans[local_98.bucket >> 7].entries
                    [(local_98.d)->spans[local_98.bucket >> 7].offsets[(uint)local_98.bucket & 0x7f]
                    ].storage.data + 0x20));
        QMimeType::QMimeType((QMimeType *)&local_50,(QMimeTypePrivate *)&local_88);
        QList<QMimeType>::emplaceBack<QMimeType>(result,(QMimeType *)&local_50);
        QMimeType::~QMimeType((QMimeType *)&local_50);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      QHashPrivate::iterator<QHashPrivate::Node<QString,_QMimeTypeXMLData>_>::operator++(&local_98);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMimeXMLProvider::addAllMimeTypes(QList<QMimeType> &result)
{
    if (result.isEmpty()) { // fast path
        for (auto it = m_nameMimeTypeMap.constBegin(), end = m_nameMimeTypeMap.constEnd();
             it != end; ++it) {
            result.append(QMimeType(QMimeTypePrivate(it.value().name)));
        }
    } else {
        for (auto it = m_nameMimeTypeMap.constBegin(), end = m_nameMimeTypeMap.constEnd() ; it != end ; ++it) {
            const QString newMime = it.key();
            if (std::find_if(result.constBegin(), result.constEnd(), [newMime](const QMimeType &mime) -> bool { return mime.name() == newMime; })
                    == result.constEnd())
                result.append(QMimeType(QMimeTypePrivate(it.value().name)));
        }
    }
}